

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc2_skey.c
# Opt level: O0

void RC2_set_key(RC2_KEY *key,int len,uchar *data,int bits)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint d;
  uint c;
  RC2_INT *ki;
  uchar *k;
  int j;
  int i;
  int bits_local;
  uchar *data_local;
  int len_local;
  RC2_KEY *key_local;
  
  *(undefined1 *)key->data = 0;
  len_local = len;
  if (0x80 < len) {
    len_local = 0x80;
  }
  bits_local = bits;
  if (bits < 1) {
    bits_local = 0x400;
  }
  if (0x400 < bits_local) {
    bits_local = 0x400;
  }
  for (i = 0; i < len_local; i = i + 1) {
    *(uchar *)((long)key->data + (long)i) = data[i];
  }
  bVar1 = *(byte *)((long)key->data + (long)(len_local + -1));
  j = 0;
  for (i = len_local; d = (uint)bVar1, i < 0x80; i = i + 1) {
    bVar1 = key_table[*(byte *)((long)key->data + (long)j) + d & 0xff];
    *(byte *)((long)key->data + (long)i) = bVar1;
    j = j + 1;
  }
  iVar2 = bits_local + 7 >> 3;
  i = 0x80 - iVar2;
  bVar1 = key_table[(uint)*(byte *)((long)key->data + (long)i) & 0xff >> (-(char)bits_local & 7U)];
  *(byte *)((long)key->data + (long)i) = bVar1;
  while (iVar3 = i + -1, i != 0) {
    bVar1 = key_table[*(byte *)((long)key->data + (long)(iVar3 + iVar2)) ^ bVar1];
    *(byte *)((long)key->data + (long)iVar3) = bVar1;
    i = iVar3;
  }
  ki = key->data + 0x3f;
  for (i = 0x7f; -1 < i; i = i + -2) {
    *ki = (uint)CONCAT11(*(undefined1 *)((long)key->data + (long)i),
                         *(undefined1 *)((long)key->data + (long)(i + -1)));
    ki = ki + -1;
  }
  return;
}

Assistant:

void RC2_set_key(RC2_KEY *key, int len, const unsigned char *data, int bits)
{
    int i, j;
    unsigned char *k;
    RC2_INT *ki;
    unsigned int c, d;

    k = (unsigned char *)&(key->data[0]);
    *k = 0;                     /* for if there is a zero length key */

    if (len > 128)
        len = 128;
    if (bits <= 0)
        bits = 1024;
    if (bits > 1024)
        bits = 1024;

    for (i = 0; i < len; i++)
        k[i] = data[i];

    /* expand table */
    d = k[len - 1];
    j = 0;
    for (i = len; i < 128; i++, j++) {
        d = key_table[(k[j] + d) & 0xff];
        k[i] = d;
    }

    /* hmm.... key reduction to 'bits' bits */

    j = (bits + 7) >> 3;
    i = 128 - j;
    c = (0xff >> (-bits & 0x07));

    d = key_table[k[i] & c];
    k[i] = d;
    while (i--) {
        d = key_table[k[i + j] ^ d];
        k[i] = d;
    }

    /* copy from bytes into RC2_INT's */
    ki = &(key->data[63]);
    for (i = 127; i >= 0; i -= 2)
        *(ki--) = ((k[i] << 8) | k[i - 1]) & 0xffff;
}